

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::allocateADC(Geometry *geo)

{
  uint uVar1;
  undefined4 *puVar2;
  void *pvVar3;
  int32 size;
  ADCData *adc;
  Geometry *geo_local;
  
  puVar2 = (undefined4 *)((long)geo->texCoords + (long)adcOffset + -0x38);
  *puVar2 = 1;
  puVar2[4] = geo->meshHeader->totalIndices;
  uVar1 = puVar2[4] + 3 & 0xfffffffc;
  pvVar3 = mustmalloc_LOC((long)(int)uVar1,0x30134,
                          "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1224"
                         );
  *(void **)(puVar2 + 2) = pvVar3;
  memset(*(void **)(puVar2 + 2),0,(long)(int)uVar1);
  return;
}

Assistant:

void
allocateADC(Geometry *geo)
{
	ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
	adc->adcFormatted = 1;
	adc->numBits = geo->meshHeader->totalIndices;
	int32 size = adc->numBits+3 & ~3;
	adc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	memset(adc->adcBits, 0, size);
}